

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlhelper.cpp
# Opt level: O0

void hsql::printExpression(Expr *expr,uintmax_t numIndent)

{
  uintmax_t numIndent_local;
  Expr *expr_local;
  
  switch(expr->type) {
  case kExprLiteralFloat:
    inprint(expr->fval,numIndent);
    break;
  case kExprLiteralString:
    inprint(expr->name,numIndent);
    break;
  case kExprLiteralInt:
    inprint(expr->ival,numIndent);
    break;
  case kExprStar:
    inprint("*",numIndent);
    break;
  default:
    fprintf(_stderr,"Unrecognized expression type %d\n",(ulong)expr->type);
    return;
  case kExprColumnRef:
    inprint(expr->name,numIndent);
    break;
  case kExprFunctionRef:
    inprint(expr->name,numIndent);
    inprint(expr->expr->name,numIndent + 1);
    break;
  case kExprOperator:
    printOperatorExpression(expr,numIndent);
  }
  if (expr->alias != (char *)0x0) {
    inprint("Alias",numIndent + 1);
    inprint(expr->alias,numIndent + 2);
  }
  return;
}

Assistant:

void printExpression(Expr* expr, uintmax_t numIndent) {
    switch (expr->type) {
    case kExprStar:
      inprint("*", numIndent);
      break;
    case kExprColumnRef:
      inprint(expr->name, numIndent);
      break;
    // case kExprTableColumnRef: inprint(expr->table, expr->name, numIndent); break;
    case kExprLiteralFloat:
      inprint(expr->fval, numIndent);
      break;
    case kExprLiteralInt:
      inprint(expr->ival, numIndent);
      break;
    case kExprLiteralString:
      inprint(expr->name, numIndent);
      break;
    case kExprFunctionRef:
      inprint(expr->name, numIndent);
      inprint(expr->expr->name, numIndent + 1);
      break;
    case kExprOperator:
      printOperatorExpression(expr, numIndent);
      break;
    default:
      fprintf(stderr, "Unrecognized expression type %d\n", expr->type);
      return;
    }
    if (expr->alias != NULL) {
      inprint("Alias", numIndent + 1);
      inprint(expr->alias, numIndent + 2);
    }
  }